

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O1

void __thiscall txvalidationcache_tests::checkinputs_test::test_method(checkinputs_test *this)

{
  CKey *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar *puVar2;
  long lVar3;
  element_type *peVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  void *pvVar8;
  uchar *puVar9;
  undefined8 *puVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  int iVar21;
  size_type sVar22;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar23;
  Chainstate *pCVar24;
  CCoinsViewCache *pCVar25;
  CScript *pCVar26;
  long lVar27;
  PrecomputedTransactionData *pPVar28;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar29;
  uint256 *puVar30;
  TxValidationState *pTVar31;
  iterator in_R8;
  iterator pvVar32;
  iterator pvVar33;
  ValidationCache *pVVar34;
  iterator in_R9;
  long lVar35;
  undefined8 uVar36;
  uint uVar37;
  long in_FS_OFFSET;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  initializer_list<CMutableTransaction> __l;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  check_type cVar43;
  undefined4 local_b74;
  long local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  char *local_b40;
  undefined1 *local_b38;
  undefined1 *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  char *local_b10;
  undefined1 *local_b08;
  undefined1 *local_b00;
  char *local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  undefined1 *local_ad8;
  undefined1 *local_ad0;
  char *local_ac8;
  char *local_ac0;
  char *local_ab8;
  char *local_ab0;
  undefined1 *local_aa8;
  undefined1 *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  long *local_a78;
  char *local_a70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig_1;
  assertion_result local_a40;
  undefined1 *local_a28;
  undefined1 *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  undefined1 *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  undefined1 *local_998;
  undefined1 *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  undefined1 *local_968;
  undefined1 *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  undefined1 *local_938;
  undefined1 *local_930;
  char *local_928;
  char *local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  undefined1 *local_8e8;
  undefined1 *local_8e0;
  char *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  undefined1 *local_888;
  undefined1 *local_880;
  char *local_878;
  char *local_870;
  CMutableTransaction spend_tx;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 local_7d0 [8];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  shared_count asStack_7b8 [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  uint256 hash;
  undefined1 local_760 [24];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_748 [5];
  _Rb_tree_node_base local_6d0;
  ListNode *local_6b0;
  vector<CTxOut,_std::allocator<CTxOut>_> local_690 [2];
  undefined1 local_660;
  direct_or_indirect local_650;
  uint local_634;
  undefined1 local_630 [16];
  PoolResource<144UL,_8UL> *local_620;
  PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>
  local_618;
  ListNode *local_610;
  _Rb_tree_node_base local_600;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  _Rb_tree_node_base local_5b8;
  ListNode *local_598;
  _Rb_tree_node_base local_588;
  size_t local_568;
  _Rb_tree_node_base local_558;
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 auStack_4e8 [12];
  uchar local_4dc [4];
  undefined1 auStack_4d8 [12];
  _Rb_tree_node_base local_4c0;
  size_t local_4a0;
  _Rb_tree_node_base local_490;
  size_t local_470;
  _Rb_tree_node_base local_460;
  size_t local_440;
  _Rb_tree_node_base local_430;
  size_t local_410;
  CMutableTransaction invalid_with_cltv_tx;
  undefined1 local_3d0 [16];
  uint256 hash_1;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks;
  TxValidationState state;
  undefined1 local_318 [16];
  pointer local_308;
  undefined3 local_300;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0 [4];
  PrecomputedTransactionData ptd_spend_tx;
  FillableSigningProvider keystore;
  CScript p2wpkh_scriptPubKey;
  CScript p2pkh_scriptPubKey;
  CScript p2sh_scriptPubKey;
  CScript p2pk_scriptPubKey;
  
  local_a40.m_message.pn.pi_ = (sp_counted_base *)local_a40.m_message.px;
  state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_allocated_capacity =
       state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish;
  bVar38 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  this_00 = &(this->super_Dersig100Setup).super_TestChain100Setup.coinbaseKey;
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&keystore,(CPubKey *)&hash);
  ppVar23 = &CScript::operator<<((CScript *)&ptd_spend_tx,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&keystore)
             ->super_CScriptBase;
  uVar37 = ppVar23->_size;
  uVar5 = uVar37 - 0x1d;
  if (uVar37 < 0x1d) {
    uVar5 = uVar37;
  }
  ppVar29 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar23->_union).indirect_contents.indirect;
  if (uVar37 < 0x1d) {
    ppVar29 = ppVar23;
  }
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar23,(uchar *)((long)&ppVar29->_union + (long)(int)uVar5),(uchar *)&vchSig);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&p2pk_scriptPubKey.super_CScriptBase,ppVar23);
  if (keystore.super_SigningProvider._vptr_SigningProvider != (_func_int **)0x0) {
    operator_delete(keystore.super_SigningProvider._vptr_SigningProvider,
                    CONCAT44(keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                             keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color)
                    - (long)keystore.super_SigningProvider._vptr_SigningProvider);
  }
  if (0x1c < CONCAT13(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems
                      [0x1f],CONCAT12(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                      m_data._M_elems[0x1e],
                                      CONCAT11(ptd_spend_tx.m_prevouts_single_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x1d],
                                               ptd_spend_tx.m_prevouts_single_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x1c])))) {
    free((void *)CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems
                          [7],CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                       m_data._M_elems[6],
                                       CONCAT15(ptd_spend_tx.m_prevouts_single_hash.
                                                super_base_blob<256U>.m_data._M_elems[5],
                                                CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                         super_base_blob<256U>.m_data._M_elems[4],
                                                         CONCAT13(ptd_spend_tx.
                                                                  m_prevouts_single_hash.
                                                                  super_base_blob<256U>.m_data.
                                                                  _M_elems[3],
                                                                  CONCAT12(ptd_spend_tx.
                                                                           m_prevouts_single_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[2],
                                                                           CONCAT11(ptd_spend_tx.
                                                                                                                                                                        
                                                  m_prevouts_single_hash.super_base_blob<256U>.
                                                  m_data._M_elems[1],
                                                  ptd_spend_tx.m_prevouts_single_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0]))))))));
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  }
  ScriptHash::ScriptHash((ScriptHash *)&ptd_spend_tx,&p2pk_scriptPubKey);
  hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  hash.super_base_blob<256U>.m_data._M_elems[1] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1];
  hash.super_base_blob<256U>.m_data._M_elems[0] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0];
  hash.super_base_blob<256U>.m_data._M_elems[2] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2];
  hash.super_base_blob<256U>.m_data._M_elems[3] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3];
  hash.super_base_blob<256U>.m_data._M_elems[4] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4];
  hash.super_base_blob<256U>.m_data._M_elems[5] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5];
  hash.super_base_blob<256U>.m_data._M_elems[6] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6];
  hash.super_base_blob<256U>.m_data._M_elems[7] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7];
  hash.super_base_blob<256U>.m_data._M_elems[9] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9];
  hash.super_base_blob<256U>.m_data._M_elems[8] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8];
  hash.super_base_blob<256U>.m_data._M_elems[10] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10];
  hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_760[0x10] = '\x03';
  GetScriptForDestination(&p2sh_scriptPubKey,(CTxDestination *)&hash);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&hash);
  CKey::GetPubKey((CPubKey *)&ptd_spend_tx,this_00);
  PKHash::PKHash((PKHash *)&keystore,(CPubKey *)&ptd_spend_tx);
  local_760[0x10] = '\x02';
  GetScriptForDestination(&p2pkh_scriptPubKey,(CTxDestination *)&hash);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&hash);
  CKey::GetPubKey((CPubKey *)&ptd_spend_tx,this_00);
  WitnessV0KeyHash::WitnessV0KeyHash((WitnessV0KeyHash *)&keystore,(CPubKey *)&ptd_spend_tx);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       (undefined1)keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
  hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color._1_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color._2_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color._3_1_;
  hash.super_base_blob<256U>.m_data._M_elems[8] = keystore.mapKeys._M_t._M_impl._0_1_;
  hash.super_base_blob<256U>.m_data._M_elems[9] = keystore.mapKeys._M_t._M_impl._1_1_;
  hash.super_base_blob<256U>.m_data._M_elems[10] = keystore.mapKeys._M_t._M_impl._2_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = keystore.mapKeys._M_t._M_impl._3_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = keystore.mapKeys._M_t._M_impl._4_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = keystore.mapKeys._M_t._M_impl._5_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = keystore.mapKeys._M_t._M_impl._6_1_;
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = keystore.mapKeys._M_t._M_impl._7_1_;
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       keystore.super_SigningProvider._vptr_SigningProvider;
  local_760[0x10] = '\x05';
  GetScriptForDestination(&p2wpkh_scriptPubKey,(CTxDestination *)&hash);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&hash);
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_013e4e20;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore._96_16_ = (undefined1  [16])0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._24_8_ =
       (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._32_8_ =
       (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_12_ =
       ZEXT412(1) << 0x40;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._20_4_ = 0;
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb1;
  file.m_begin = (iterator)&local_7e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_7f0,msg);
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  _cVar43 = 0x6c63c0;
  iVar21 = (*keystore.super_SigningProvider._vptr_SigningProvider[10])(&keystore,this_00,&hash);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar21;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "keystore.AddKey(coinbaseKey)";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3df0;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_7f8 = "";
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x0;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &vchSig;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar43,
             (size_t)&local_800,0xb1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_810 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xb2;
  file_00.m_begin = (iterator)&local_810;
  msg_00.m_end = pvVar33;
  msg_00.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_820,
             msg_00);
  _cVar43 = 0x6c64a3;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] =
       FillableSigningProvider::AddCScript(&keystore,&p2pk_scriptPubKey);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)"keystore.AddCScript(p2pk_scriptPubKey)";
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3df0;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &vchSig;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_828 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar43,
             (size_t)&local_830,0xb2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  CMutableTransaction::CMutableTransaction(&spend_tx);
  spend_tx.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&spend_tx.vin,1);
  peVar4 = (((this->super_Dersig100Setup).super_TestChain100Setup.m_coinbase_txns.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar36 = *(undefined8 *)&(peVar4->hash).m_wrapped;
  uVar6 = *(undefined8 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar7 = *(undefined8 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)
   (((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((peVar4->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)
   (((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uVar7;
  *(undefined8 *)
   ((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar36;
  *(undefined8 *)
   (((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
     ._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
  ((spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
   _M_start)->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&spend_tx.vout,4);
  (spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_start)->nValue = 11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&((spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &p2sh_scriptPubKey.super_CScriptBase);
  spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[1].nValue = 11000000;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[1].scriptPubKey.super_CScriptBase,
             &p2wpkh_scriptPubKey.super_CScriptBase);
  spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[2].nValue = 11000000;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = 0xb1;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ptd_spend_tx,
             (iterator)&ptd_spend_tx,(uchar *)&hash);
  uVar5 = CONCAT13(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f],
                   CONCAT12(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data.
                            _M_elems[0x1e],
                            CONCAT11(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                     m_data._M_elems[0x1d],
                                     ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                     m_data._M_elems[0x1c])));
  uVar37 = uVar5 - 0x1d;
  if (uVar5 < 0x1d) {
    uVar37 = uVar5;
  }
  pPVar28 = (PrecomputedTransactionData *)
            CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7],
                     CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data.
                              _M_elems[6],
                              CONCAT15(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                       m_data._M_elems[5],
                                       CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                super_base_blob<256U>.m_data._M_elems[4],
                                                CONCAT13(ptd_spend_tx.m_prevouts_single_hash.
                                                         super_base_blob<256U>.m_data._M_elems[3],
                                                         CONCAT12(ptd_spend_tx.
                                                                  m_prevouts_single_hash.
                                                                  super_base_blob<256U>.m_data.
                                                                  _M_elems[2],
                                                                  CONCAT11(ptd_spend_tx.
                                                                           m_prevouts_single_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[1],
                                                                           ptd_spend_tx.
                                                                           m_prevouts_single_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[0])))))))
  ;
  if (uVar5 < 0x1d) {
    pPVar28 = &ptd_spend_tx;
  }
  hash.super_base_blob<256U>.m_data._M_elems[0] = 'u';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ptd_spend_tx,
             (iterator)
             (((direct_or_indirect *)&pPVar28->m_prevouts_single_hash)->direct + (int)uVar37),
             (uchar *)&hash);
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>(&vchSig,(CPubKey *)&hash);
  ppVar23 = &CScript::operator<<((CScript *)&ptd_spend_tx,&vchSig)->super_CScriptBase;
  uVar37 = ppVar23->_size;
  uVar5 = uVar37 - 0x1d;
  if (uVar37 < 0x1d) {
    uVar5 = uVar37;
  }
  ppVar29 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar23->_union).indirect_contents.indirect;
  if (uVar37 < 0x1d) {
    ppVar29 = ppVar23;
  }
  state.super_ValidationState<TxValidationResult>.m_mode._0_1_ = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar23,(uchar *)((long)&ppVar29->_union + (long)(int)uVar5),(uchar *)&state);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[2].scriptPubKey.super_CScriptBase,ppVar23);
  if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (0x1c < CONCAT13(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems
                      [0x1f],CONCAT12(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                      m_data._M_elems[0x1e],
                                      CONCAT11(ptd_spend_tx.m_prevouts_single_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x1d],
                                               ptd_spend_tx.m_prevouts_single_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x1c])))) {
    free((void *)CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems
                          [7],CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                       m_data._M_elems[6],
                                       CONCAT15(ptd_spend_tx.m_prevouts_single_hash.
                                                super_base_blob<256U>.m_data._M_elems[5],
                                                CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                         super_base_blob<256U>.m_data._M_elems[4],
                                                         CONCAT13(ptd_spend_tx.
                                                                  m_prevouts_single_hash.
                                                                  super_base_blob<256U>.m_data.
                                                                  _M_elems[3],
                                                                  CONCAT12(ptd_spend_tx.
                                                                           m_prevouts_single_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[2],
                                                                           CONCAT11(ptd_spend_tx.
                                                                                                                                                                        
                                                  m_prevouts_single_hash.super_base_blob<256U>.
                                                  m_data._M_elems[1],
                                                  ptd_spend_tx.m_prevouts_single_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0]))))))));
  }
  spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start[3].nValue = 11000000;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = 0xb2;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ptd_spend_tx,
             (iterator)&ptd_spend_tx,(uchar *)&hash);
  uVar5 = CONCAT13(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f],
                   CONCAT12(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data.
                            _M_elems[0x1e],
                            CONCAT11(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                     m_data._M_elems[0x1d],
                                     ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                     m_data._M_elems[0x1c])));
  uVar37 = uVar5 - 0x1d;
  if (uVar5 < 0x1d) {
    uVar37 = uVar5;
  }
  pPVar28 = (PrecomputedTransactionData *)
            CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7],
                     CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data.
                              _M_elems[6],
                              CONCAT15(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                       m_data._M_elems[5],
                                       CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                super_base_blob<256U>.m_data._M_elems[4],
                                                CONCAT13(ptd_spend_tx.m_prevouts_single_hash.
                                                         super_base_blob<256U>.m_data._M_elems[3],
                                                         CONCAT12(ptd_spend_tx.
                                                                  m_prevouts_single_hash.
                                                                  super_base_blob<256U>.m_data.
                                                                  _M_elems[2],
                                                                  CONCAT11(ptd_spend_tx.
                                                                           m_prevouts_single_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[1],
                                                                           ptd_spend_tx.
                                                                           m_prevouts_single_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[0])))))))
  ;
  if (uVar5 < 0x1d) {
    pPVar28 = &ptd_spend_tx;
  }
  hash.super_base_blob<256U>.m_data._M_elems[0] = 'u';
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ptd_spend_tx,
             (iterator)
             (((direct_or_indirect *)&pPVar28->m_prevouts_single_hash)->direct + (int)uVar37),
             (uchar *)&hash);
  CKey::GetPubKey((CPubKey *)&hash,this_00);
  ToByteVector<CPubKey>(&vchSig,(CPubKey *)&hash);
  ppVar23 = &CScript::operator<<((CScript *)&ptd_spend_tx,&vchSig)->super_CScriptBase;
  uVar37 = ppVar23->_size;
  uVar5 = uVar37 - 0x1d;
  if (uVar37 < 0x1d) {
    uVar5 = uVar37;
  }
  ppVar29 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar23->_union).indirect_contents.indirect;
  if (uVar37 < 0x1d) {
    ppVar29 = ppVar23;
  }
  state.super_ValidationState<TxValidationResult>.m_mode._0_1_ = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar23,(uchar *)((long)&ppVar29->_union + (long)(int)uVar5),(uchar *)&state);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start[3].scriptPubKey.super_CScriptBase,ppVar23);
  if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (0x1c < CONCAT13(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems
                      [0x1f],CONCAT12(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                      m_data._M_elems[0x1e],
                                      CONCAT11(ptd_spend_tx.m_prevouts_single_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x1d],
                                               ptd_spend_tx.m_prevouts_single_hash.
                                               super_base_blob<256U>.m_data._M_elems[0x1c])))) {
    free((void *)CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems
                          [7],CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                       m_data._M_elems[6],
                                       CONCAT15(ptd_spend_tx.m_prevouts_single_hash.
                                                super_base_blob<256U>.m_data._M_elems[5],
                                                CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                         super_base_blob<256U>.m_data._M_elems[4],
                                                         CONCAT13(ptd_spend_tx.
                                                                  m_prevouts_single_hash.
                                                                  super_base_blob<256U>.m_data.
                                                                  _M_elems[3],
                                                                  CONCAT12(ptd_spend_tx.
                                                                           m_prevouts_single_hash.
                                                                           super_base_blob<256U>.
                                                                           m_data._M_elems[2],
                                                                           CONCAT11(ptd_spend_tx.
                                                                                                                                                                        
                                                  m_prevouts_single_hash.super_base_blob<256U>.
                                                  m_data._M_elems[1],
                                                  ptd_spend_tx.m_prevouts_single_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0]))))))));
  }
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar28 = &ptd_spend_tx;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  pvVar32 = (iterator)0x1;
  SignatureHash<CMutableTransaction>
            (&hash,&p2pk_scriptPubKey,&spend_tx,0,1,(CAmount *)pPVar28,BASE,
             (PrecomputedTransactionData *)0x0);
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_870 = "";
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xcc;
  file_01.m_begin = (iterator)&local_878;
  msg_01.m_end = (iterator)pPVar28;
  msg_01.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_888,
             msg_01);
  _cVar43 = 0x6c6919;
  state.super_ValidationState<TxValidationResult>.m_mode._0_1_ =
       CKey::Sign(this_00,&hash,&vchSig,true,0);
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)0x0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b62a6c;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(anon_var_dwarf_1b62a6c + 0x1e);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = 0xf0;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] = '=';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] = '=';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] = '\x01';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '8';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = 0x81;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '>';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\x01';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       (uchar)&invalid_with_cltv_tx;
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       (uchar)((ulong)&invalid_with_cltv_tx >> 8);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       (uchar)((ulong)&invalid_with_cltv_tx >> 0x10);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       (uchar)((ulong)&invalid_with_cltv_tx >> 0x18);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       (uchar)((ulong)&invalid_with_cltv_tx >> 0x20);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       (uchar)((ulong)&invalid_with_cltv_tx >> 0x28);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       (uchar)((ulong)&invalid_with_cltv_tx >> 0x30);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       (uchar)((ulong)&invalid_with_cltv_tx >> 0x38);
  local_898 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_890 = "";
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&state,(lazy_ostream *)&ptd_spend_tx,1,0,WARN,_cVar43,
             (size_t)&local_898,0xcc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&vchSig,(uchar *)&ptd_spend_tx);
  ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&vchSig,(uchar *)&ptd_spend_tx);
  CScript::operator<<(&(spend_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->scriptSig,&vchSig);
  if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  criticalblock19.super_unique_lock._M_device._0_1_ = 0x38;
  criticalblock19.super_unique_lock._M_device._1_7_ = 0x13e75;
  criticalblock19.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock19.super_unique_lock);
  paVar1 = &state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<TxValidationResult>.m_mode._0_1_ = M_VALID;
  state.super_ValidationState<TxValidationResult>._1_7_ = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<TxValidationResult>.m_debug_message._8_9_ = ZEXT89(0);
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)paVar1
  ;
  memset(&ptd_spend_tx,0,0x102);
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._0_9_ = SUB169((undefined1  [16])0x0,0);
  ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  ptd_spend_tx._280_9_ = SUB169((undefined1  [16])0x0,7);
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8a0 = "";
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xdb;
  file_02.m_begin = (iterator)&local_8a8;
  msg_02.m_end = pvVar33;
  msg_02.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_8b8,
             msg_02);
  CTransaction::CTransaction((CTransaction *)&vchSig,&spend_tx);
  pCVar24 = ChainstateManager::ActiveChainstate
                      ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar25 = Chainstate::CoinsTip(pCVar24);
  _cVar43 = 0x6c6b09;
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar25,false);
  bVar20 = CheckInputScripts((CTransaction *)&vchSig,&state,(CCoinsViewCache *)&hash,5,true,true,
                             &ptd_spend_tx,
                             &((this->super_Dersig100Setup).super_TestChain100Setup.
                               super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                               m_node.chainman._M_t.
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                              m_validation_cache,
                             (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
  hash_1.super_base_blob<256U>.m_data._M_elems[0] = !bVar20;
  hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf9600c;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)
       "!CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, nullptr)"
  ;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8c0 = "";
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x0;
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&scriptchecks;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_1,(lazy_ostream *)&invalid_with_cltv_tx,1,0,WARN,_cVar43,
             (size_t)&local_8c8,0xdb);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR_GetCoin_013e3490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_630 + 8));
  if (local_660 != '\0') {
    ((CCoinsCacheEntry *)
    ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 0x28))->m_prev =
         (CoinsCachePair *)
         local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish + 0x30) =
         local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_660 = '\0';
  }
  if (0x1c < local_634) {
    free(local_650.indirect_contents.indirect);
    local_650.indirect_contents.indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)local_760);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8d0 = "";
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe1;
  file_03.m_begin = (iterator)&local_8d8;
  msg_03.m_end = pvVar33;
  msg_03.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_8e8,
             msg_03);
  CTransaction::CTransaction((CTransaction *)&vchSig,&spend_tx);
  pCVar24 = ChainstateManager::ActiveChainstate
                      ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar25 = Chainstate::CoinsTip(pCVar24);
  _cVar43 = 0x6c6d2f;
  CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar25,false);
  bVar20 = CheckInputScripts((CTransaction *)&vchSig,&state,(CCoinsViewCache *)&hash,5,true,true,
                             &ptd_spend_tx,
                             &((this->super_Dersig100Setup).super_TestChain100Setup.
                               super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                               m_node.chainman._M_t.
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                              m_validation_cache,&scriptchecks);
  hash_1.super_base_blob<256U>.m_data._M_elems[0] = bVar20;
  hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&vchSig_1;
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xd;
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_7_ = 0xf960;
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0xe7;
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0xf960;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_8f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_8f0 = "";
  pvVar32 = (iterator)0x1;
  pvVar33 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_1,(lazy_ostream *)&invalid_with_cltv_tx,1,0,WARN,_cVar43,
             (size_t)&local_8f8,0xe1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR_GetCoin_013e3490;
  std::
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_630 + 8));
  if (local_660 != '\0') {
    ((CCoinsCacheEntry *)
    ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 0x28))->m_prev =
         (CoinsCachePair *)
         local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_finish + 0x30) =
         local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_660 = '\0';
  }
  if (0x1c < local_634) {
    free(local_650.indirect_contents.indirect);
    local_650.indirect_contents.indirect = (char *)0x0;
  }
  PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)local_760);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
  local_908 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_900 = "";
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xe2;
  file_04.m_begin = (iterator)&local_908;
  msg_04.m_end = pvVar33;
  msg_04.m_begin = pvVar32;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_918,
             msg_04);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._9_8_ << 8);
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3cb0;
  invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf98c4c;
  local_a78 = (long *)(((long)scriptchecks.
                              super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)scriptchecks.
                              super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  local_a40._0_8_ = &local_a78;
  criticalblock20.super_unique_lock._M_device = (mutex_type *)local_7d0;
  hash_1.super_base_blob<256U>.m_data._M_elems[0] =
       (long)scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
             super__Vector_impl_data._M_start == 0x50;
  local_7d0._0_4_ = 1;
  hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0x82;
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_7_ = 0xf95d;
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0xeb;
  vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0xf95d;
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cf0;
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_a40;
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0._M_allocated_capacity = (size_type)&criticalblock20;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3d30;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pvVar32 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&hash_1,(lazy_ostream *)&invalid_with_cltv_tx,1,2,REQUIRE,0xf960e8,
             (size_t)&vchSig_1,0xe2,(CCoinsViewCache *)&hash,"1U",
             (vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
  CTransaction::CTransaction((CTransaction *)&hash,&spend_tx);
  pCVar24 = ChainstateManager::ActiveChainstate
                      ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  pCVar25 = Chainstate::CoinsTip(pCVar24);
  ValidateCheckInputsForAllFlags
            ((CTransaction *)&hash,0xe,false,pCVar25,
             &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
               super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector(&scriptchecks);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&ptd_spend_tx.m_spent_outputs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p !=
      &state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
    operator_delete(state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p
                    ,state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                     _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p != paVar1)
  {
    operator_delete(state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                    ,CONCAT71(state.super_ValidationState<TxValidationResult>.m_reject_reason.
                              field_2._M_allocated_capacity._1_7_,
                              state.super_ValidationState<TxValidationResult>.m_reject_reason.
                              field_2._M_local_buf[0]) + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock19.super_unique_lock);
  local_308 = (pointer)0x0;
  local_318 = (undefined1  [16])0x0;
  stack0xfffffffffffffcd8 = (undefined1  [16])0x0;
  state.super_ValidationState<TxValidationResult>.m_debug_message._8_16_ = (undefined1  [16])0x0;
  state.super_ValidationState<TxValidationResult>._32_16_ = (undefined1  [16])0x0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_allocated_capacity.
  _1_7_ = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)0x0;
  state.super_ValidationState<TxValidationResult>._1_7_ = 0;
  state.super_ValidationState<TxValidationResult>.m_mode._0_1_ = M_VALID;
  local_300 = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx,&spend_tx.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x18),
             &spend_tx.vout);
  ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems._20_4_ =
       spend_tx.nLockTime;
  ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems._16_4_ =
       spend_tx.version;
  __l._M_len = 1;
  __l._M_array = (iterator)&ptd_spend_tx;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             &invalid_with_cltv_tx,__l,(allocator_type *)&hash_1);
  pvVar33 = (iterator)0x0;
  TestChain100Setup::CreateAndProcessBlock
            ((CBlock *)&hash,(TestChain100Setup *)this,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             &invalid_with_cltv_tx,&p2pk_scriptPubKey,(Chainstate *)0x0);
  puVar30 = &hash;
  pTVar31 = &state;
  for (lVar27 = 10;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_308, lVar27 != 0;
      lVar27 = lVar27 + -1) {
    uVar36 = *(undefined8 *)(puVar30->super_base_blob<256U>).m_data._M_elems;
    (pTVar31->super_ValidationState<TxValidationResult>).m_mode = (int)uVar36;
    (pTVar31->super_ValidationState<TxValidationResult>).m_result = (int)((ulong)uVar36 >> 0x20);
    puVar30 = (uint256 *)((long)puVar30 + (ulong)bVar38 * -0x10 + 8);
    pTVar31 = (TxValidationState *)((long)pTVar31 + (ulong)bVar38 * -0x10 + 8);
  }
  local_308 = local_748[0].
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318._0_8_;
  vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_318._8_8_;
  local_748[0].
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_748[0].
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_748[0].
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&vchSig);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(local_748);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             &invalid_with_cltv_tx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x18));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx);
  criticalblock20.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock20.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock20.super_unique_lock);
  local_928 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
  ;
  local_920 = "";
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xf1;
  file_05.m_begin = (iterator)&local_928;
  msg_05.m_end = pvVar32;
  msg_05.m_begin = pvVar33;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_938,
             msg_05);
  pCVar24 = ChainstateManager::ActiveChainstate
                      ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar30 = (pCVar24->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar30 != (uint256 *)0x0) {
    hash.super_base_blob<256U>.m_data._M_elems._0_16_ =
         *(undefined1 (*) [16])(puVar30->super_base_blob<256U>).m_data._M_elems;
    hash.super_base_blob<256U>.m_data._M_elems._16_16_ =
         *(undefined1 (*) [16])((puVar30->super_base_blob<256U>).m_data._M_elems + 0x10);
    _cVar43 = 0x6c737e;
    CBlockHeader::GetHash(&ptd_spend_tx.m_prevouts_single_hash,(CBlockHeader *)&state);
    auVar40[0] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar40[1] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar40[2] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar40[3] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar40[4] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar40[5] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar40[6] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar40[7] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar40[8] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar40[9] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar40[10] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a]
                   == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar40[0xb] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar40[0xc] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar40[0xd] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar40[0xe] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar40[0xf] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar39[0] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                  hash.super_base_blob<256U>.m_data._M_elems[0]);
    auVar39[1] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                  hash.super_base_blob<256U>.m_data._M_elems[1]);
    auVar39[2] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                  hash.super_base_blob<256U>.m_data._M_elems[2]);
    auVar39[3] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                  hash.super_base_blob<256U>.m_data._M_elems[3]);
    auVar39[4] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                  hash.super_base_blob<256U>.m_data._M_elems[4]);
    auVar39[5] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                  hash.super_base_blob<256U>.m_data._M_elems[5]);
    auVar39[6] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                  hash.super_base_blob<256U>.m_data._M_elems[6]);
    auVar39[7] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                  hash.super_base_blob<256U>.m_data._M_elems[7]);
    auVar39[8] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                  hash.super_base_blob<256U>.m_data._M_elems[8]);
    auVar39[9] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                  hash.super_base_blob<256U>.m_data._M_elems[9]);
    auVar39[10] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                   hash.super_base_blob<256U>.m_data._M_elems[10]);
    auVar39[0xb] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar39[0xc] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar39[0xd] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar39[0xe] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar39[0xf] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar39 = auVar39 & auVar40;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(invalid_with_cltv_tx.vin.
                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           (ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) == 0xffff);
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b62b2e;
    hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ =
         (long)"m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash()" + 0x47;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_948 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_940 = "";
    pvVar32 = (iterator)0x1;
    pvVar33 = (iterator)0x0;
    local_2e0._M_allocated_capacity = (size_type)(pointer)&hash_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&invalid_with_cltv_tx,(lazy_ostream *)&vchSig,1,0,WARN,_cVar43,
               (size_t)&local_948,0xf1);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    local_958 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_950 = "";
    local_968 = &boost::unit_test::basic_cstring<char_const>::null;
    local_960 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0xf2;
    file_06.m_begin = (iterator)&local_958;
    msg_06.m_end = pvVar33;
    msg_06.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_968,
               msg_06);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    (*(pCVar25->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(&hash,pCVar25);
    _cVar43 = 0x6c74b5;
    CBlockHeader::GetHash(&ptd_spend_tx.m_prevouts_single_hash,(CBlockHeader *)&state);
    auVar41[0] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                  hash.super_base_blob<256U>.m_data._M_elems[0]);
    auVar41[1] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                  hash.super_base_blob<256U>.m_data._M_elems[1]);
    auVar41[2] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                  hash.super_base_blob<256U>.m_data._M_elems[2]);
    auVar41[3] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                  hash.super_base_blob<256U>.m_data._M_elems[3]);
    auVar41[4] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                  hash.super_base_blob<256U>.m_data._M_elems[4]);
    auVar41[5] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                  hash.super_base_blob<256U>.m_data._M_elems[5]);
    auVar41[6] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                  hash.super_base_blob<256U>.m_data._M_elems[6]);
    auVar41[7] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                  hash.super_base_blob<256U>.m_data._M_elems[7]);
    auVar41[8] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                  hash.super_base_blob<256U>.m_data._M_elems[8]);
    auVar41[9] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                  hash.super_base_blob<256U>.m_data._M_elems[9]);
    auVar41[10] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                   hash.super_base_blob<256U>.m_data._M_elems[10]);
    auVar41[0xb] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar41[0xc] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar41[0xd] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar41[0xe] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar41[0xf] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf]
                    == hash.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar42[0] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar42[1] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar42[2] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar42[3] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar42[4] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar42[5] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar42[6] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar42[7] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar42[8] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x18]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar42[9] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x19]
                  == hash.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar42[10] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1a]
                   == hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar42[0xb] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1b]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar42[0xc] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1c]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar42[0xd] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1d]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar42[0xe] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1e]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar42[0xf] = -(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x1f]
                    == hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar41 = auVar41 & auVar42;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(invalid_with_cltv_tx.vin.
                           super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,
                           (ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff);
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1b62bc1;
    hash_1.super_base_blob<256U>.m_data._M_elems._8_8_ = anon_var_dwarf_1b62bc1 + 0x50;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_978 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_970 = "";
    local_2e0._M_allocated_capacity = (size_type)(pointer)&hash_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&invalid_with_cltv_tx,(lazy_ostream *)&vchSig,1,0,WARN,_cVar43,
               (size_t)&local_978,0xf2);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&ptd_spend_tx);
    ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\x01';
    ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ptd_spend_tx.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx,1);
    CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
    puVar2 = ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x18;
    puVar9 = (uchar *)CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data.
                               _M_elems[7],
                               CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                        m_data._M_elems[6],
                                        CONCAT15(ptd_spend_tx.m_prevouts_single_hash.
                                                 super_base_blob<256U>.m_data._M_elems[5],
                                                 CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                          super_base_blob<256U>.m_data._M_elems[4],
                                                          CONCAT13(ptd_spend_tx.
                                                                   m_prevouts_single_hash.
                                                                   super_base_blob<256U>.m_data.
                                                                   _M_elems[3],
                                                                   CONCAT12(ptd_spend_tx.
                                                                            m_prevouts_single_hash.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[2],
                                                                            CONCAT11(ptd_spend_tx.
                                                                                                                                                                          
                                                  m_prevouts_single_hash.super_base_blob<256U>.
                                                  m_data._M_elems[1],
                                                  ptd_spend_tx.m_prevouts_single_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0])))))));
    *(undefined8 *)(puVar9 + 0x10) = hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(puVar9 + 0x18) = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)puVar9 = hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(puVar9 + 8) = hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined4 *)
     (CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[7],
               CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[6]
                        ,CONCAT15(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data.
                                  _M_elems[5],
                                  CONCAT14(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>
                                           .m_data._M_elems[4],
                                           CONCAT13(ptd_spend_tx.m_prevouts_single_hash.
                                                    super_base_blob<256U>.m_data._M_elems[3],
                                                    CONCAT12(ptd_spend_tx.m_prevouts_single_hash.
                                                             super_base_blob<256U>.m_data._M_elems
                                                             [2],CONCAT11(ptd_spend_tx.
                                                                          m_prevouts_single_hash.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[1],
                                                                          ptd_spend_tx.
                                                                          m_prevouts_single_hash.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[0])))))))
     + 0x20) = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)puVar2,1);
    puVar10 = (undefined8 *)
              CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems
                       [0x1f],CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.
                                       m_data._M_elems[0x1e],
                                       CONCAT15(ptd_spend_tx.m_prevouts_single_hash.
                                                super_base_blob<256U>.m_data._M_elems[0x1d],
                                                CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                         super_base_blob<256U>.m_data._M_elems[0x1c]
                                                         ,CONCAT13(ptd_spend_tx.
                                                                   m_prevouts_single_hash.
                                                                   super_base_blob<256U>.m_data.
                                                                   _M_elems[0x1b],
                                                                   CONCAT12(ptd_spend_tx.
                                                                            m_prevouts_single_hash.
                                                                            super_base_blob<256U>.
                                                                            m_data._M_elems[0x1a],
                                                                            CONCAT11(ptd_spend_tx.
                                                                                                                                                                          
                                                  m_prevouts_single_hash.super_base_blob<256U>.
                                                  m_data._M_elems[0x19],
                                                  ptd_spend_tx.m_prevouts_single_hash.
                                                  super_base_blob<256U>.m_data._M_elems[0x18])))))))
    ;
    *puVar10 = 11000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(puVar10 + 1),
               &p2pk_scriptPubKey.super_CScriptBase);
    uVar36 = &p2pk_scriptPubKey.super_CScriptBase;
    sVar22 = p2pk_scriptPubKey.super_CScriptBase._size;
    if (0x1c < p2pk_scriptPubKey.super_CScriptBase._size) {
      uVar36 = p2pk_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
      sVar22 = p2pk_scriptPubKey.super_CScriptBase._size - 0x1d;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vchSig,(iterator)uVar36,
               (uchar *)(uVar36 + (long)(int)sVar22),(allocator_type *)&hash);
    CScript::operator<<((CScript *)
                        (CONCAT17(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data.
                                  _M_elems[7],
                                  CONCAT16(ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>
                                           .m_data._M_elems[6],
                                           CONCAT15(ptd_spend_tx.m_prevouts_single_hash.
                                                    super_base_blob<256U>.m_data._M_elems[5],
                                                    CONCAT14(ptd_spend_tx.m_prevouts_single_hash.
                                                             super_base_blob<256U>.m_data._M_elems
                                                             [4],CONCAT13(ptd_spend_tx.
                                                                          m_prevouts_single_hash.
                                                                          super_base_blob<256U>.
                                                                          m_data._M_elems[3],
                                                                          CONCAT12(ptd_spend_tx.
                                                                                                                                                                      
                                                  m_prevouts_single_hash.super_base_blob<256U>.
                                                  m_data._M_elems[2],
                                                  CONCAT11(ptd_spend_tx.m_prevouts_single_hash.
                                                           super_base_blob<256U>.m_data._M_elems[1],
                                                           ptd_spend_tx.m_prevouts_single_hash.
                                                           super_base_blob<256U>.m_data._M_elems[0])
                                                  )))))) + 0x28),&vchSig);
    CTransaction::CTransaction((CTransaction *)&hash,(CMutableTransaction *)&ptd_spend_tx);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    ValidateCheckInputsForAllFlags
              ((CTransaction *)&hash,1,true,pCVar25,
               &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                m_validation_cache);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
    if (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)puVar2);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx);
    CMutableTransaction::CMutableTransaction(&invalid_with_cltv_tx);
    invalid_with_cltv_tx.version = 1;
    invalid_with_cltv_tx.nLockTime = 100;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&invalid_with_cltv_tx.vin,1);
    CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
    *(undefined8 *)
     (((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x10) = hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     (((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 0x18) = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     ((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
     _M_elems = hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     (((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
      _M_elems + 8) = hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    ((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start)->prevout).n = 2;
    (invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
     super__Vector_impl_data._M_start)->nSequence = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&invalid_with_cltv_tx.vout,1);
    (invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
     super__Vector_impl_data._M_start)->nValue = 11000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                  _M_impl.super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
               &p2pk_scriptPubKey.super_CScriptBase);
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_7_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar30 = &hash;
    auVar11._8_8_ = 0;
    auVar11[0] = hash.super_base_blob<256U>.m_data._M_elems[8];
    auVar11[1] = hash.super_base_blob<256U>.m_data._M_elems[9];
    auVar11[2] = hash.super_base_blob<256U>.m_data._M_elems[10];
    auVar11[3] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
    auVar11[4] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
    auVar11[5] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
    auVar11[6] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
    auVar11[7] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar11 << 0x40;
    pvVar32 = (iterator)0x1;
    SignatureHash<CMutableTransaction>
              (&hash_1,&spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_start[2].scriptPubKey,&invalid_with_cltv_tx,0,1,
               (CAmount *)puVar30,BASE,(PrecomputedTransactionData *)0x0);
    local_988 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_980 = "";
    local_998 = &boost::unit_test::basic_cstring<char_const>::null;
    local_990 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x115;
    file_07.m_begin = (iterator)&local_988;
    msg_07.m_end = (iterator)puVar30;
    msg_07.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_998,
               msg_07);
    _cVar43 = 0x6c785c;
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] =
         CKey::Sign(this_00,&hash_1,&vchSig_1,true,0);
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(anon_var_dwarf_1b62a6c + 0x1e);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b62a6c;
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3df0;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &vchSig;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_9a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_9a0 = "";
    pvVar32 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar43,
               (size_t)&local_9a8,0x115);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vchSig_1,(uchar *)&hash);
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pCVar26 = CScript::operator<<((CScript *)&hash,&vchSig_1);
    ppVar23 = &CScript::push_int64(pCVar26,0x65)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                  .super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar23);
    if (0x1c < (uint)hash.super_base_blob<256U>.m_data._M_elems._28_4_) {
      free((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_);
      auVar12._8_8_ = 0;
      auVar12[0] = hash.super_base_blob<256U>.m_data._M_elems[8];
      auVar12[1] = hash.super_base_blob<256U>.m_data._M_elems[9];
      auVar12[2] = hash.super_base_blob<256U>.m_data._M_elems[10];
      auVar12[3] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
      auVar12[4] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
      auVar12[5] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
      auVar12[6] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
      auVar12[7] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
      hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar12 << 0x40;
    }
    CTransaction::CTransaction((CTransaction *)&hash,&invalid_with_cltv_tx);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    pVVar34 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                _M_t.
                super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache
    ;
    ValidateCheckInputsForAllFlags((CTransaction *)&hash,0x200,true,pCVar25,pVVar34);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pCVar26 = CScript::operator<<((CScript *)&hash,&vchSig_1);
    ppVar23 = &CScript::push_int64(pCVar26,100)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (&((invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                  .super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,ppVar23);
    if (0x1c < (uint)hash.super_base_blob<256U>.m_data._M_elems._28_4_) {
      free((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_);
      auVar13._8_8_ = 0;
      auVar13[0] = hash.super_base_blob<256U>.m_data._M_elems[8];
      auVar13[1] = hash.super_base_blob<256U>.m_data._M_elems[9];
      auVar13[2] = hash.super_base_blob<256U>.m_data._M_elems[10];
      auVar13[3] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
      auVar13[4] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
      auVar13[5] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
      auVar13[6] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
      auVar13[7] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
      hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar13 << 0x40;
    }
    auVar19._8_8_ = 0;
    auVar19._0_8_ = &local_2e0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._0_16_ = auVar19 << 0x40;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e0._M_allocated_capacity = local_2e0._M_allocated_capacity & 0xffffffffffffff00;
    local_2c8 = 0;
    local_2c0[0]._M_local_buf[0] = false;
    local_2d0._M_p = (pointer)local_2c0;
    memset((PrecomputedTransactionData *)&hash,0,0x102);
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._0_9_ = SUB169((undefined1  [16])0x0,0);
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._1_1_ = '\0';
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._2_1_ = '\0';
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._3_1_ = '\0';
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._4_1_ = '\0';
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._5_1_ = '\0';
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._6_1_ = '\0';
    local_690[0].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
    ._M_finish._7_1_ = '\0';
    local_690._16_9_ = SUB169((undefined1  [16])0x0,7);
    local_9b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_9b0 = "";
    local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x11f;
    file_08.m_begin = (iterator)&local_9b8;
    msg_08.m_end = pvVar32;
    msg_08.m_begin = (iterator)pVVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_9c8,
               msg_08);
    CTransaction::CTransaction((CTransaction *)&ptd_spend_tx,&invalid_with_cltv_tx);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    _cVar43 = 0x6c7b03;
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    criticalblock19.super_unique_lock._M_device._0_1_ =
         CheckInputScripts((CTransaction *)&ptd_spend_tx,(TxValidationState *)&vchSig,pCVar25,0x200,
                           true,true,(PrecomputedTransactionData *)&hash,
                           &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup
                             .super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                            m_validation_cache,
                           (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
    criticalblock19.super_unique_lock._M_owns = false;
    criticalblock19.super_unique_lock._9_7_ = 0;
    asStack_7b8[0].pi_ = (sp_counted_base *)0x0;
    local_a40._0_8_ =
         "CheckInputScripts(CTransaction(invalid_with_cltv_tx), state, m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr)"
    ;
    local_a40.m_message.px = (element_type *)0xf9621e;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_9d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_9d0 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&criticalblock19,(lazy_ostream *)&scriptchecks,1,0,WARN,_cVar43,
               (size_t)&local_9d8,0x11f);
    boost::detail::shared_count::~shared_count(asStack_7b8);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(local_690);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_p != local_2c0) {
      operator_delete(local_2d0._M_p,
                      CONCAT71(local_2c0[0]._M_allocated_capacity._1_7_,local_2c0[0]._M_local_buf[0]
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish != &local_2e0) {
      operator_delete(vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
                      (ulong)(local_2e0._M_allocated_capacity + 1));
    }
    pvVar8 = (void *)CONCAT71(vchSig_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              vchSig_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pvVar8 != (void *)0x0) {
      operator_delete(pvVar8,(long)vchSig_1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar8
                     );
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&invalid_with_cltv_tx.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&invalid_with_cltv_tx.vin);
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&hash_1);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash_1,1);
    CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
    puVar2 = hash_1.super_base_blob<256U>.m_data._M_elems + 0x18;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x10) =
         hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x18) =
         hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
         hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 8) =
         hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined4 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x20) = 3;
    *(undefined4 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x48) = 100;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)puVar2,1);
    *(undefined8 *)hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = 11000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ + 8),
               &p2pk_scriptPubKey.super_CScriptBase);
    criticalblock19.super_unique_lock._M_device._0_1_ = 0;
    criticalblock19.super_unique_lock._M_device._1_7_ = 0;
    criticalblock19.super_unique_lock._M_owns = false;
    criticalblock19.super_unique_lock._9_7_ = 0;
    asStack_7b8[0].pi_ = (sp_counted_base *)0x0;
    puVar30 = &hash;
    auVar14._8_8_ = 0;
    auVar14[0] = hash.super_base_blob<256U>.m_data._M_elems[8];
    auVar14[1] = hash.super_base_blob<256U>.m_data._M_elems[9];
    auVar14[2] = hash.super_base_blob<256U>.m_data._M_elems[10];
    auVar14[3] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
    auVar14[4] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
    auVar14[5] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
    auVar14[6] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
    auVar14[7] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar14 << 0x40;
    pvVar32 = (iterator)0x1;
    SignatureHash<CMutableTransaction>
              ((uint256 *)&scriptchecks,
               &spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start[3].scriptPubKey,(CMutableTransaction *)&hash_1,0,1,
               (CAmount *)puVar30,BASE,(PrecomputedTransactionData *)0x0);
    local_9e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_9e0 = "";
    local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0x131;
    file_09.m_begin = (iterator)&local_9e8;
    msg_09.m_end = (iterator)puVar30;
    msg_09.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_9f8,
               msg_09);
    _cVar43 = 0x6c7de1;
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0] =
         CKey::Sign(this_00,(uint256 *)&scriptchecks,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&criticalblock19,true,0
                   );
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(anon_var_dwarf_1b62a6c + 0x1e);
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1b62a6c;
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3df0;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (TxValidationState *)&vchSig;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_a08 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_a00 = "";
    pvVar32 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ptd_spend_tx,(lazy_ostream *)&hash,1,0,WARN,_cVar43,
               (size_t)&local_a08,0x131);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&criticalblock19,
               (uchar *)&hash);
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pCVar26 = CScript::operator<<((CScript *)&hash,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &criticalblock19);
    ppVar23 = &CScript::push_int64(pCVar26,0x65)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x28),ppVar23);
    if (0x1c < (uint)hash.super_base_blob<256U>.m_data._M_elems._28_4_) {
      free((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_);
      auVar15._8_8_ = 0;
      auVar15[0] = hash.super_base_blob<256U>.m_data._M_elems[8];
      auVar15[1] = hash.super_base_blob<256U>.m_data._M_elems[9];
      auVar15[2] = hash.super_base_blob<256U>.m_data._M_elems[10];
      auVar15[3] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
      auVar15[4] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
      auVar15[5] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
      auVar15[6] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
      auVar15[7] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
      hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar15 << 0x40;
    }
    CTransaction::CTransaction((CTransaction *)&hash,(CMutableTransaction *)&hash_1);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    pVVar34 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                _M_t.
                super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache
    ;
    ValidateCheckInputsForAllFlags((CTransaction *)&hash,0x400,true,pCVar25,pVVar34);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    pCVar26 = CScript::operator<<((CScript *)&hash,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &criticalblock19);
    ppVar23 = &CScript::push_int64(pCVar26,100)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x28),ppVar23);
    if (0x1c < (uint)hash.super_base_blob<256U>.m_data._M_elems._28_4_) {
      free((void *)hash.super_base_blob<256U>.m_data._M_elems._0_8_);
      auVar16._8_8_ = 0;
      auVar16[0] = hash.super_base_blob<256U>.m_data._M_elems[8];
      auVar16[1] = hash.super_base_blob<256U>.m_data._M_elems[9];
      auVar16[2] = hash.super_base_blob<256U>.m_data._M_elems[10];
      auVar16[3] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
      auVar16[4] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
      auVar16[5] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
      auVar16[6] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
      auVar16[7] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
      hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar16 << 0x40;
    }
    invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_3d0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&invalid_with_cltv_tx.vout;
    invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)invalid_with_cltv_tx.vout.
                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    invalid_with_cltv_tx.version = 0;
    invalid_with_cltv_tx.nLockTime = 0;
    local_3d0[0] = 0;
    memset(&ptd_spend_tx,0,0x102);
    ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._0_9_ = SUB169((undefined1  [16])0x0,0);
    ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    ptd_spend_tx._280_9_ = SUB169((undefined1  [16])0x0,7);
    local_a18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_a10 = "";
    local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a20 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x13b;
    file_10.m_begin = (iterator)&local_a18;
    msg_10.m_end = pvVar32;
    msg_10.m_begin = (iterator)pVVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_a28,
               msg_10);
    CTransaction::CTransaction((CTransaction *)&vchSig,(CMutableTransaction *)&hash_1);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    _cVar43 = 0x6c8094;
    CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar25,false);
    bVar20 = CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&invalid_with_cltv_tx,
                               (CCoinsViewCache *)&hash,0x400,true,true,&ptd_spend_tx,
                               &((this->super_Dersig100Setup).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.chainman._M_t.
                                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                                m_validation_cache,
                               (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
    local_a40.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar20;
    local_a40.m_message.px = (element_type *)0x0;
    local_a40.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a78 = (long *)0xf9621f;
    local_a70 = "";
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0xf0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_7_ = 0x13d3d;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_a88 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_a80 = "";
    pvVar32 = (iterator)0x1;
    pvVar33 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_a40,(lazy_ostream *)&vchSig_1,1,0,WARN,_cVar43,(size_t)&local_a88,0x13b);
    boost::detail::shared_count::~shared_count(&local_a40.m_message.pn);
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR_GetCoin_013e3490;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_630 + 8));
    if (local_660 != '\0') {
      ((CCoinsCacheEntry *)
      ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 0x28))->m_prev =
           (CoinsCachePair *)
           local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish + 0x30) =
           local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_660 = '\0';
    }
    if (0x1c < local_634) {
      free(local_650.indirect_contents.indirect);
      local_650.indirect_contents.indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)local_760);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&ptd_spend_tx.m_spent_outputs);
    if (invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)local_3d0) {
      operator_delete(invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(local_3d0._1_7_,local_3d0[0]) + 1);
    }
    if (invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)&invalid_with_cltv_tx.vout) {
      operator_delete(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
                      (ulong)((long)&(invalid_with_cltv_tx.vout.
                                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                      super__Vector_impl_data._M_start)->nValue + 1));
    }
    pvVar8 = (void *)CONCAT71(criticalblock19.super_unique_lock._M_device._1_7_,
                              criticalblock19.super_unique_lock._M_device._0_1_);
    if (pvVar8 != (void *)0x0) {
      operator_delete(pvVar8,(long)asStack_7b8[0].pi_ - (long)pvVar8);
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)puVar2);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash_1);
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&vchSig);
    local_2c8 = CONCAT44(local_2c8._4_4_,1);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig,1);
    CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
    *(undefined8 *)
     (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 0x10) = hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 0x18) = hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)
     vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)
     (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start + 8) = hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x20] = '\x01';
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x21] = '\0';
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x22] = '\0';
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x23] = '\0';
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0,1);
    *(undefined8 *)local_2e0._M_allocated_capacity = 11000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (local_2e0._M_allocated_capacity + 8),&p2pk_scriptPubKey.super_CScriptBase);
    auVar17._14_2_ = 0;
    auVar17[0] = hash.super_base_blob<256U>.m_data._M_elems[2];
    auVar17[1] = hash.super_base_blob<256U>.m_data._M_elems[3];
    auVar17[2] = hash.super_base_blob<256U>.m_data._M_elems[4];
    auVar17[3] = hash.super_base_blob<256U>.m_data._M_elems[5];
    auVar17[4] = hash.super_base_blob<256U>.m_data._M_elems[6];
    auVar17[5] = hash.super_base_blob<256U>.m_data._M_elems[7];
    auVar17[6] = hash.super_base_blob<256U>.m_data._M_elems[8];
    auVar17[7] = hash.super_base_blob<256U>.m_data._M_elems[9];
    auVar17[8] = hash.super_base_blob<256U>.m_data._M_elems[10];
    auVar17[9] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
    auVar17[10] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
    auVar17[0xb] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
    auVar17[0xc] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
    auVar17[0xd] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar17 << 0x10;
    local_6d0._M_color = _S_red;
    local_6d0._M_parent = (_Base_ptr)0x0;
    memset(hash.super_base_blob<256U>.m_data._M_elems + 8,0,0xb8);
    local_6b0 = (ListNode *)0x0;
    local_650.direct[0x10] = '\0';
    local_620 = (PoolResource<144UL,_8UL> *)local_630;
    local_630._0_4_ = _S_red;
    local_630._8_8_ = (_Base_ptr)0x0;
    local_610 = (ListNode *)0x0;
    local_600._M_left = &local_600;
    local_600._M_color = _S_red;
    local_600._M_parent = (_Base_ptr)0x0;
    local_5b8._M_left = &local_5b8;
    local_5b8._M_color = _S_red;
    local_5b8._M_parent = (_Base_ptr)0x0;
    local_5e0 = (undefined1  [16])0x0;
    local_5d0 = (undefined1  [16])0x0;
    local_598 = (ListNode *)0x0;
    local_588._M_left = &local_588;
    local_588._M_color = _S_red;
    local_588._M_parent = (_Base_ptr)0x0;
    local_568 = 0;
    local_558._M_left = &local_558;
    local_558._M_color = _S_red;
    local_558._M_parent = (_Base_ptr)0x0;
    local_4c0._M_left = &local_4c0;
    local_4c0._M_color = _S_red;
    local_4c0._M_parent = (_Base_ptr)0x0;
    auStack_4d8 = SUB1612((undefined1  [16])0x0,4);
    auStack_4e8 = SUB1612((undefined1  [16])0x0,0);
    local_4dc[0] = '\0';
    local_4dc[1] = '\0';
    local_4dc[2] = '\0';
    local_4dc[3] = '\0';
    local_4f8 = (undefined1  [16])0x0;
    local_508 = (undefined1  [16])0x0;
    local_518 = (undefined1  [16])0x0;
    local_528 = (undefined1  [16])0x0;
    local_538 = (undefined1  [16])0x0;
    local_4a0 = 0;
    local_490._M_left = &local_490;
    local_490._M_color = _S_red;
    local_490._M_parent = (_Base_ptr)0x0;
    local_470 = 0;
    local_460._M_left = &local_460;
    local_460._M_color = _S_red;
    local_460._M_parent = (_Base_ptr)0x0;
    local_440 = 0;
    local_430._M_left = &local_430;
    local_430._M_color = _S_red;
    local_430._M_parent = (_Base_ptr)0x0;
    local_410 = 0;
    local_a98 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_a90 = "";
    local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_aa0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x14e;
    file_11.m_begin = (iterator)&local_a98;
    msg_11.m_end = pvVar33;
    msg_11.m_begin = pvVar32;
    local_6d0._M_left = &local_6d0;
    local_6d0._M_right = &local_6d0;
    local_618.m_resource = local_620;
    local_600._M_right = local_600._M_left;
    local_5b8._M_right = local_5b8._M_left;
    local_588._M_right = local_588._M_left;
    local_558._M_right = local_558._M_left;
    local_4c0._M_right = local_4c0._M_left;
    local_490._M_right = local_490._M_left;
    local_460._M_right = local_460._M_left;
    local_430._M_right = local_430._M_left;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_aa8,
               msg_11);
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0xc0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_7_ = 0xa7d8;
    MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
              ((MutableTransactionSignatureCreator *)&ptd_spend_tx,(CMutableTransaction *)&vchSig,0,
               (CAmount *)&vchSig_1,1);
    _cVar43 = 0x6c8505;
    bVar20 = ProduceSignature(&keystore.super_SigningProvider,(BaseSignatureCreator *)&ptd_spend_tx,
                              &spend_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                               _M_impl.super__Vector_impl_data._M_start[1].scriptPubKey,
                              (SignatureData *)&hash);
    hash_1.super_base_blob<256U>.m_data._M_elems[0] = bVar20;
    hash_1.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    hash_1.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf96389;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)
         "ProduceSignature(keystore, MutableTransactionSignatureCreator(valid_with_witness_tx, 0, 11 * CENT, SIGHASH_ALL), spend_tx.vout[1].scriptPubKey, sigdata)"
    ;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                   _M_impl.super__Vector_impl_data._9_8_ << 8);
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&scriptchecks;
    local_ab8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_ab0 = "";
    pvVar32 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&hash_1,(lazy_ostream *)&invalid_with_cltv_tx,1,0,WARN,_cVar43,
               (size_t)&local_ab8,0x14e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)(hash_1.super_base_blob<256U>.m_data._M_elems + 0x10));
    UpdateInput((CTxIn *)vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,(SignatureData *)&hash);
    CTransaction::CTransaction((CTransaction *)&ptd_spend_tx,(CMutableTransaction *)&vchSig);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    ValidateCheckInputsForAllFlags
              ((CTransaction *)&ptd_spend_tx,0,true,pCVar25,
               &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                 super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                m_validation_cache);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx);
    CScriptWitness::SetNull
              ((CScriptWitness *)
               (vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + 0x50));
    CTransaction::CTransaction((CTransaction *)&ptd_spend_tx,(CMutableTransaction *)&vchSig);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    pVVar34 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                _M_t.
                super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache
    ;
    ValidateCheckInputsForAllFlags((CTransaction *)&ptd_spend_tx,0x800,true,pCVar25,pVVar34);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (ptd_spend_tx.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&ptd_spend_tx);
    SignatureData::~SignatureData((SignatureData *)&hash);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)&hash_1);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash_1,2);
    CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x10) =
         hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x18) =
         hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ =
         hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 8) =
         hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined4 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x20) = 0;
    CMutableTransaction::GetHash((Txid *)&hash,&spend_tx);
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x78) =
         hash.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x80) =
         hash.super_base_blob<256U>.m_data._M_elems._24_8_;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x68) =
         hash.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x70) =
         hash.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined4 *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x88) = 1;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (hash_1.super_base_blob<256U>.m_data._M_elems + 0x18),1);
    *(undefined8 *)hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ = 22000000;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               (hash_1.super_base_blob<256U>.m_data._M_elems._24_8_ + 8),
               &p2pk_scriptPubKey.super_CScriptBase);
    lVar35 = 8;
    uVar37 = 0;
    lVar27 = 0;
    do {
      auVar18._14_2_ = 0;
      auVar18[0] = hash.super_base_blob<256U>.m_data._M_elems[2];
      auVar18[1] = hash.super_base_blob<256U>.m_data._M_elems[3];
      auVar18[2] = hash.super_base_blob<256U>.m_data._M_elems[4];
      auVar18[3] = hash.super_base_blob<256U>.m_data._M_elems[5];
      auVar18[4] = hash.super_base_blob<256U>.m_data._M_elems[6];
      auVar18[5] = hash.super_base_blob<256U>.m_data._M_elems[7];
      auVar18[6] = hash.super_base_blob<256U>.m_data._M_elems[8];
      auVar18[7] = hash.super_base_blob<256U>.m_data._M_elems[9];
      auVar18[8] = hash.super_base_blob<256U>.m_data._M_elems[10];
      auVar18[9] = hash.super_base_blob<256U>.m_data._M_elems[0xb];
      auVar18[10] = hash.super_base_blob<256U>.m_data._M_elems[0xc];
      auVar18[0xb] = hash.super_base_blob<256U>.m_data._M_elems[0xd];
      auVar18[0xc] = hash.super_base_blob<256U>.m_data._M_elems[0xe];
      auVar18[0xd] = hash.super_base_blob<256U>.m_data._M_elems[0xf];
      hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar18 << 0x10;
      local_6d0._M_color = _S_red;
      local_6d0._M_parent = (_Base_ptr)0x0;
      memset(hash.super_base_blob<256U>.m_data._M_elems + 8,0,0xb8);
      local_6d0._M_left = &local_6d0;
      local_6b0 = (ListNode *)0x0;
      local_650.direct[0x10] = '\0';
      local_630._0_4_ = _S_red;
      local_630._8_8_ = (_Base_ptr)0x0;
      local_620 = (PoolResource<144UL,_8UL> *)local_630;
      local_610 = (ListNode *)0x0;
      local_600._M_color = _S_red;
      local_600._M_parent = (_Base_ptr)0x0;
      local_600._M_left = &local_600;
      local_5b8._M_color = _S_red;
      local_5b8._M_parent = (_Base_ptr)0x0;
      local_5e0 = (undefined1  [16])0x0;
      local_5d0 = (undefined1  [16])0x0;
      local_5b8._M_left = &local_5b8;
      local_598 = (ListNode *)0x0;
      local_588._M_color = _S_red;
      local_588._M_parent = (_Base_ptr)0x0;
      local_588._M_left = &local_588;
      local_568 = 0;
      local_558._M_color = _S_red;
      local_558._M_parent = (_Base_ptr)0x0;
      local_558._M_left = &local_558;
      local_4c0._M_color = _S_red;
      local_4c0._M_parent = (_Base_ptr)0x0;
      local_538 = (undefined1  [16])0x0;
      local_528 = (undefined1  [16])0x0;
      local_518 = (undefined1  [16])0x0;
      local_508 = (undefined1  [16])0x0;
      local_4f8 = (undefined1  [16])0x0;
      auStack_4e8 = SUB1612((undefined1  [16])0x0,0);
      local_4dc[0] = '\0';
      local_4dc[1] = '\0';
      local_4dc[2] = '\0';
      local_4dc[3] = '\0';
      auStack_4d8 = SUB1612((undefined1  [16])0x0,4);
      local_4c0._M_left = &local_4c0;
      local_4a0 = 0;
      local_490._M_color = _S_red;
      local_490._M_parent = (_Base_ptr)0x0;
      local_490._M_left = &local_490;
      local_470 = 0;
      local_460._M_color = _S_red;
      local_460._M_parent = (_Base_ptr)0x0;
      local_460._M_left = &local_460;
      local_440 = 0;
      local_430._M_color = _S_red;
      local_430._M_parent = (_Base_ptr)0x0;
      local_430._M_left = &local_430;
      local_410 = 0;
      local_ac8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_ac0 = "";
      local_ad8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_ad0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_12.m_end = (iterator)0x16a;
      file_12.m_begin = (iterator)&local_ac8;
      msg_12.m_end = pvVar32;
      msg_12.m_begin = (iterator)pVVar34;
      local_6d0._M_right = local_6d0._M_left;
      local_618.m_resource = local_620;
      local_600._M_right = local_600._M_left;
      local_5b8._M_right = local_5b8._M_left;
      local_588._M_right = local_588._M_left;
      local_558._M_right = local_558._M_left;
      local_4c0._M_right = local_4c0._M_left;
      local_490._M_right = local_490._M_left;
      local_460._M_right = local_460._M_left;
      local_430._M_right = local_430._M_left;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_ad8,
                 msg_12);
      vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = 0xc0;
      vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_7_ = 0xa7d8;
      MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                ((MutableTransactionSignatureCreator *)&ptd_spend_tx,(CMutableTransaction *)&hash_1,
                 uVar37,(CAmount *)&vchSig_1,1);
      _cVar43 = 0x6c8a91;
      bVar20 = ProduceSignature(&keystore.super_SigningProvider,
                                (BaseSignatureCreator *)&ptd_spend_tx,
                                (CScript *)
                                ((long)&(spend_tx.vout.
                                         super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                                         .super__Vector_impl_data._M_start)->nValue + lVar35),
                                (SignatureData *)&hash);
      invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(invalid_with_cltv_tx.vin.
                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start._1_7_,bVar20);
      invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0xf9640f;
      scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)
           "ProduceSignature(keystore, MutableTransactionSignatureCreator(tx, i, 11 * CENT, SIGHASH_ALL), spend_tx.vout[i].scriptPubKey, sigdata)"
      ;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
      vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
      local_2e0._M_allocated_capacity = (size_type)&scriptchecks;
      local_ae8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
      ;
      local_ae0 = "";
      pVVar34 = (ValidationCache *)0x1;
      pvVar32 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&invalid_with_cltv_tx,(lazy_ostream *)&vchSig,1,0,WARN,_cVar43,
                 (size_t)&local_ae8,0x16a);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      UpdateInput((CTxIn *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + lVar27),
                  (SignatureData *)&hash);
      SignatureData::~SignatureData((SignatureData *)&hash);
      lVar35 = lVar35 + 0x28;
      lVar27 = lVar27 + 0x68;
      uVar37 = uVar37 + 1;
    } while (lVar35 == 0x30);
    CTransaction::CTransaction((CTransaction *)&hash,(CMutableTransaction *)&hash_1);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    pVVar34 = &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                _M_t.
                super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_validation_cache
    ;
    ValidateCheckInputsForAllFlags((CTransaction *)&hash,0,true,pCVar25,pVVar34);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (hash.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash);
    CScriptWitness::SetNull
              ((CScriptWitness *)(hash_1.super_base_blob<256U>.m_data._M_elems._0_8_ + 0xb8));
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&invalid_with_cltv_tx.vout;
    invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)invalid_with_cltv_tx.vout.
                          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xffffffffffffff00);
    invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_3d0;
    invalid_with_cltv_tx.version = 0;
    invalid_with_cltv_tx.nLockTime = 0;
    local_3d0[0] = 0;
    memset(&ptd_spend_tx,0,0x102);
    ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._0_9_ = SUB169((undefined1  [16])0x0,0);
    ptd_spend_tx.m_spent_outputs.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    ptd_spend_tx._280_9_ = SUB169((undefined1  [16])0x0,7);
    local_af8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_af0 = "";
    local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b00 = &boost::unit_test::basic_cstring<char_const>::null;
    file_13.m_end = (iterator)0x179;
    file_13.m_begin = (iterator)&local_af8;
    msg_13.m_end = pvVar32;
    msg_13.m_begin = (iterator)pVVar34;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_b08,
               msg_13);
    CTransaction::CTransaction((CTransaction *)&vchSig,(CMutableTransaction *)&hash_1);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    _cVar43 = 0x6c8cf8;
    CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar25,false);
    bVar20 = CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&invalid_with_cltv_tx,
                               (CCoinsViewCache *)&hash,0x801,true,true,&ptd_spend_tx,
                               &((this->super_Dersig100Setup).super_TestChain100Setup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.chainman._M_t.
                                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                                m_validation_cache,
                               (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0);
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = !bVar20;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    criticalblock19.super_unique_lock._M_device._0_1_ = 0x10;
    criticalblock19.super_unique_lock._M_device._1_7_ = 0xf964;
    criticalblock19.super_unique_lock._M_owns = true;
    criticalblock19.super_unique_lock._9_7_ = 0xf964;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_b18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_b10 = "";
    pvVar32 = (iterator)0x1;
    pvVar33 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&vchSig_1,(lazy_ostream *)&scriptchecks,1,0,WARN,_cVar43,
               (size_t)&local_b18,0x179);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR_GetCoin_013e3490;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_630 + 8));
    if (local_660 != '\0') {
      ((CCoinsCacheEntry *)
      ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 0x28))->m_prev =
           (CoinsCachePair *)
           local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish + 0x30) =
           local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_660 = '\0';
    }
    if (0x1c < local_634) {
      free(local_650.indirect_contents.indirect);
      local_650.indirect_contents.indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)local_760);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
    criticalblock19.super_unique_lock._M_device._0_1_ = 0;
    criticalblock19.super_unique_lock._M_device._1_7_ = 0;
    criticalblock19.super_unique_lock._M_owns = false;
    criticalblock19.super_unique_lock._9_7_ = 0;
    asStack_7b8[0].pi_ = (sp_counted_base *)0x0;
    local_b28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_b20 = "";
    local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b30 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x17e;
    file_14.m_begin = (iterator)&local_b28;
    msg_14.m_end = pvVar33;
    msg_14.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_b38,
               msg_14);
    CTransaction::CTransaction((CTransaction *)&vchSig,(CMutableTransaction *)&hash_1);
    pCVar24 = ChainstateManager::ActiveChainstate
                        ((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup.
                         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    pCVar25 = Chainstate::CoinsTip(pCVar24);
    _cVar43 = 0x6c8eec;
    CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&hash,(CCoinsView *)pCVar25,false);
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ =
         CheckInputScripts((CTransaction *)&vchSig,(TxValidationState *)&invalid_with_cltv_tx,
                           (CCoinsViewCache *)&hash,0x801,true,true,&ptd_spend_tx,
                           &((this->super_Dersig100Setup).super_TestChain100Setup.super_TestingSetup
                             .super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                            m_validation_cache,
                           (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&criticalblock19);
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a40._0_8_ =
         "CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, &scriptchecks)"
    ;
    local_a40.m_message.px = (element_type *)0xf965aa;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3df0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_b48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_b40 = "";
    pvVar32 = (iterator)0x1;
    pvVar33 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&vchSig_1,(lazy_ostream *)&scriptchecks,1,0,WARN,_cVar43,
               (size_t)&local_b48,0x17e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR_GetCoin_013e3490;
    std::
    _Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<COutPoint,_std::pair<const_COutPoint,_CCoinsCacheEntry>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_630 + 8));
    if (local_660 != '\0') {
      ((CCoinsCacheEntry *)
      ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + 0x28))->m_prev =
           (CoinsCachePair *)
           local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish + 0x30) =
           local_690[1].super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_660 = '\0';
    }
    if (0x1c < local_634) {
      free(local_650.indirect_contents.indirect);
      local_650.indirect_contents.indirect = (char *)0x0;
    }
    PoolResource<144UL,_8UL>::~PoolResource((PoolResource<144UL,_8UL> *)local_760);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_2e0);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
    local_b58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_b50 = "";
    local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b60 = &boost::unit_test::basic_cstring<char_const>::null;
    file_15.m_end = (iterator)0x180;
    file_15.m_begin = (iterator)&local_b58;
    msg_15.m_end = pvVar33;
    msg_15.m_begin = pvVar32;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_b68,
               msg_15);
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3cb0;
    scriptchecks.super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    lVar27 = CONCAT71(criticalblock19.super_unique_lock._9_7_,
                      criticalblock19.super_unique_lock._M_owns) -
             CONCAT71(criticalblock19.super_unique_lock._M_device._1_7_,
                      criticalblock19.super_unique_lock._M_device._0_1_);
    local_b70 = (lVar27 >> 4) * -0x3333333333333333;
    local_a78 = &local_b70;
    local_7d0 = (undefined1  [8])&local_b74;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = lVar27 == 0xa0;
    local_b74 = 2;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a40._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/txvalidationcache_tests.cpp"
    ;
    local_a40.m_message.px = (element_type *)0xf95deb;
    hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013d3cf0;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_a78;
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d3d30;
    vchSig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
    local_2e0._M_allocated_capacity = (size_type)local_7d0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&vchSig_1,(lazy_ostream *)&scriptchecks,1,2,REQUIRE,0xf960e8,
               (size_t)&local_a40,0x180,(CCoinsViewCache *)&hash,"2U",
               (vector<CTxIn,_std::allocator<CTxIn>_> *)&vchSig);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &vchSig_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
              ((vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)&criticalblock19);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&ptd_spend_tx.m_spent_outputs);
    if (invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)local_3d0) {
      operator_delete(invalid_with_cltv_tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      CONCAT71(local_3d0._1_7_,local_3d0[0]) + 1);
    }
    if (invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)&invalid_with_cltv_tx.vout) {
      operator_delete(invalid_with_cltv_tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                      _M_impl.super__Vector_impl_data._M_finish,
                      (ulong)((long)&(invalid_with_cltv_tx.vout.
                                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                                      super__Vector_impl_data._M_start)->nValue + 1));
    }
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               (hash_1.super_base_blob<256U>.m_data._M_elems + 0x18));
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&hash_1);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock20.super_unique_lock);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)local_318);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&spend_tx.vout);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&spend_tx.vin);
    keystore.super_SigningProvider._vptr_SigningProvider =
         (_func_int **)&PTR__FillableSigningProvider_013e4e20;
    std::
    _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
    ::~_Rb_tree(&keystore.mapScripts._M_t);
    std::
    _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
    ::~_Rb_tree(&keystore.mapKeys._M_t);
    if (0x1c < p2wpkh_scriptPubKey.super_CScriptBase._size) {
      free(p2wpkh_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
      p2wpkh_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x1c < p2pkh_scriptPubKey.super_CScriptBase._size) {
      free(p2pkh_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
      p2pkh_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x1c < p2sh_scriptPubKey.super_CScriptBase._size) {
      free(p2sh_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
      p2sh_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
    if (0x1c < p2pk_scriptPubKey.super_CScriptBase._size) {
      free(p2pk_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
      p2pk_scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(checkinputs_test, Dersig100Setup)
{
    // Test that passing CheckInputScripts with one set of script flags doesn't imply
    // that we would pass again with a different set of flags.
    CScript p2pk_scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    CScript p2sh_scriptPubKey = GetScriptForDestination(ScriptHash(p2pk_scriptPubKey));
    CScript p2pkh_scriptPubKey = GetScriptForDestination(PKHash(coinbaseKey.GetPubKey()));
    CScript p2wpkh_scriptPubKey = GetScriptForDestination(WitnessV0KeyHash(coinbaseKey.GetPubKey()));

    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKey(coinbaseKey));
    BOOST_CHECK(keystore.AddCScript(p2pk_scriptPubKey));

    // flags to test: SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, SCRIPT_VERIFY_CHECKSEQUENCE_VERIFY, SCRIPT_VERIFY_NULLDUMMY, uncompressed pubkey thing

    // Create 2 outputs that match the three scripts above, spending the first
    // coinbase tx.
    CMutableTransaction spend_tx;

    spend_tx.version = 1;
    spend_tx.vin.resize(1);
    spend_tx.vin[0].prevout.hash = m_coinbase_txns[0]->GetHash();
    spend_tx.vin[0].prevout.n = 0;
    spend_tx.vout.resize(4);
    spend_tx.vout[0].nValue = 11*CENT;
    spend_tx.vout[0].scriptPubKey = p2sh_scriptPubKey;
    spend_tx.vout[1].nValue = 11*CENT;
    spend_tx.vout[1].scriptPubKey = p2wpkh_scriptPubKey;
    spend_tx.vout[2].nValue = 11*CENT;
    spend_tx.vout[2].scriptPubKey = CScript() << OP_CHECKLOCKTIMEVERIFY << OP_DROP << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    spend_tx.vout[3].nValue = 11*CENT;
    spend_tx.vout[3].scriptPubKey = CScript() << OP_CHECKSEQUENCEVERIFY << OP_DROP << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;

    // Sign, with a non-DER signature
    {
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(p2pk_scriptPubKey, spend_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char) 0); // padding byte makes this non-DER
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        spend_tx.vin[0].scriptSig << vchSig;
    }

    // Test that invalidity under a set of flags doesn't preclude validity
    // under other (eg consensus) flags.
    // spend_tx is invalid according to DERSIG
    {
        LOCK(cs_main);

        TxValidationState state;
        PrecomputedTransactionData ptd_spend_tx;

        BOOST_CHECK(!CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, nullptr));

        // If we call again asking for scriptchecks (as happens in
        // ConnectBlock), we should add a script check object for this -- we're
        // not caching invalidity (if that changes, delete this test case).
        std::vector<CScriptCheck> scriptchecks;
        BOOST_CHECK(CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, &scriptchecks));
        BOOST_CHECK_EQUAL(scriptchecks.size(), 1U);

        // Test that CheckInputScripts returns true iff DERSIG-enforcing flags are
        // not present.  Don't add these checks to the cache, so that we can
        // test later that block validation works fine in the absence of cached
        // successes.
        ValidateCheckInputsForAllFlags(CTransaction(spend_tx), SCRIPT_VERIFY_DERSIG | SCRIPT_VERIFY_LOW_S | SCRIPT_VERIFY_STRICTENC, false, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    // And if we produce a block with this tx, it should be valid (DERSIG not
    // enabled yet), even though there's no cache entry.
    CBlock block;

    block = CreateAndProcessBlock({spend_tx}, p2pk_scriptPubKey);
    LOCK(cs_main);
    BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash());
    BOOST_CHECK(m_node.chainman->ActiveChainstate().CoinsTip().GetBestBlock() == block.GetHash());

    // Test P2SH: construct a transaction that is valid without P2SH, and
    // then test validity with P2SH.
    {
        CMutableTransaction invalid_under_p2sh_tx;
        invalid_under_p2sh_tx.version = 1;
        invalid_under_p2sh_tx.vin.resize(1);
        invalid_under_p2sh_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_under_p2sh_tx.vin[0].prevout.n = 0;
        invalid_under_p2sh_tx.vout.resize(1);
        invalid_under_p2sh_tx.vout[0].nValue = 11*CENT;
        invalid_under_p2sh_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;
        std::vector<unsigned char> vchSig2(p2pk_scriptPubKey.begin(), p2pk_scriptPubKey.end());
        invalid_under_p2sh_tx.vin[0].scriptSig << vchSig2;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_under_p2sh_tx), SCRIPT_VERIFY_P2SH, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    // Test CHECKLOCKTIMEVERIFY
    {
        CMutableTransaction invalid_with_cltv_tx;
        invalid_with_cltv_tx.version = 1;
        invalid_with_cltv_tx.nLockTime = 100;
        invalid_with_cltv_tx.vin.resize(1);
        invalid_with_cltv_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_with_cltv_tx.vin[0].prevout.n = 2;
        invalid_with_cltv_tx.vin[0].nSequence = 0;
        invalid_with_cltv_tx.vout.resize(1);
        invalid_with_cltv_tx.vout[0].nValue = 11*CENT;
        invalid_with_cltv_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(spend_tx.vout[2].scriptPubKey, invalid_with_cltv_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        invalid_with_cltv_tx.vin[0].scriptSig = CScript() << vchSig << 101;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_with_cltv_tx), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Make it valid, and check again
        invalid_with_cltv_tx.vin[0].scriptSig = CScript() << vchSig << 100;
        TxValidationState state;
        PrecomputedTransactionData txdata;
        BOOST_CHECK(CheckInputScripts(CTransaction(invalid_with_cltv_tx), state, m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));
    }

    // TEST CHECKSEQUENCEVERIFY
    {
        CMutableTransaction invalid_with_csv_tx;
        invalid_with_csv_tx.version = 2;
        invalid_with_csv_tx.vin.resize(1);
        invalid_with_csv_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_with_csv_tx.vin[0].prevout.n = 3;
        invalid_with_csv_tx.vin[0].nSequence = 100;
        invalid_with_csv_tx.vout.resize(1);
        invalid_with_csv_tx.vout[0].nValue = 11*CENT;
        invalid_with_csv_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(spend_tx.vout[3].scriptPubKey, invalid_with_csv_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        invalid_with_csv_tx.vin[0].scriptSig = CScript() << vchSig << 101;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_with_csv_tx), SCRIPT_VERIFY_CHECKSEQUENCEVERIFY, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Make it valid, and check again
        invalid_with_csv_tx.vin[0].scriptSig = CScript() << vchSig << 100;
        TxValidationState state;
        PrecomputedTransactionData txdata;
        BOOST_CHECK(CheckInputScripts(CTransaction(invalid_with_csv_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKSEQUENCEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));
    }

    // TODO: add tests for remaining script flags

    // Test that passing CheckInputScripts with a valid witness doesn't imply success
    // for the same tx with a different witness.
    {
        CMutableTransaction valid_with_witness_tx;
        valid_with_witness_tx.version = 1;
        valid_with_witness_tx.vin.resize(1);
        valid_with_witness_tx.vin[0].prevout.hash = spend_tx.GetHash();
        valid_with_witness_tx.vin[0].prevout.n = 1;
        valid_with_witness_tx.vout.resize(1);
        valid_with_witness_tx.vout[0].nValue = 11*CENT;
        valid_with_witness_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        SignatureData sigdata;
        BOOST_CHECK(ProduceSignature(keystore, MutableTransactionSignatureCreator(valid_with_witness_tx, 0, 11 * CENT, SIGHASH_ALL), spend_tx.vout[1].scriptPubKey, sigdata));
        UpdateInput(valid_with_witness_tx.vin[0], sigdata);

        // This should be valid under all script flags.
        ValidateCheckInputsForAllFlags(CTransaction(valid_with_witness_tx), 0, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Remove the witness, and check that it is now invalid.
        valid_with_witness_tx.vin[0].scriptWitness.SetNull();
        ValidateCheckInputsForAllFlags(CTransaction(valid_with_witness_tx), SCRIPT_VERIFY_WITNESS, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    {
        // Test a transaction with multiple inputs.
        CMutableTransaction tx;

        tx.version = 1;
        tx.vin.resize(2);
        tx.vin[0].prevout.hash = spend_tx.GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vin[1].prevout.hash = spend_tx.GetHash();
        tx.vin[1].prevout.n = 1;
        tx.vout.resize(1);
        tx.vout[0].nValue = 22*CENT;
        tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        for (int i = 0; i < 2; ++i) {
            SignatureData sigdata;
            BOOST_CHECK(ProduceSignature(keystore, MutableTransactionSignatureCreator(tx, i, 11 * CENT, SIGHASH_ALL), spend_tx.vout[i].scriptPubKey, sigdata));
            UpdateInput(tx.vin[i], sigdata);
        }

        // This should be valid under all script flags
        ValidateCheckInputsForAllFlags(CTransaction(tx), 0, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Check that if the second input is invalid, but the first input is
        // valid, the transaction is not cached.
        // Invalidate vin[1]
        tx.vin[1].scriptWitness.SetNull();

        TxValidationState state;
        PrecomputedTransactionData txdata;
        // This transaction is now invalid under segwit, because of the second input.
        BOOST_CHECK(!CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));

        std::vector<CScriptCheck> scriptchecks;
        // Make sure this transaction was not cached (ie because the first
        // input was valid)
        BOOST_CHECK(CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, &scriptchecks));
        // Should get 2 script checks back -- caching is on a whole-transaction basis.
        BOOST_CHECK_EQUAL(scriptchecks.size(), 2U);
    }
}